

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  pointer pbVar6;
  size_type sVar7;
  pointer ppVar8;
  string sStack_98;
  pointer pbStack_78;
  pointer pbStack_70;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_68;
  string sStack_50;
  
  if ((this->super_cmScriptGenerator).ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
    return;
  }
  this->TestGenerated = true;
  pcVar2 = this->Test;
  std::__cxx11::string::string
            ((string *)&sStack_50,
             (string *)
             (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_50);
  operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(os,"add_test(");
  std::__cxx11::string::string((string *)&sStack_98,(string *)&this->Test->Name);
  poVar5 = std::operator<<(os,(string *)&sStack_98);
  poVar5 = std::operator<<(poVar5," \"");
  poVar5 = std::operator<<(poVar5,(string *)&sStack_50);
  std::operator<<(poVar5,"\"");
  std::__cxx11::string::~string((string *)&sStack_98);
  pbStack_78 = (pcVar2->Command).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pbVar6 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar6 + 1 != pbStack_78) {
    pbStack_70 = pbVar6 + 1;
    std::operator<<(os," \"");
    pcVar3 = pbVar6[1]._M_dataplus._M_p;
    sVar4 = pbVar6[1]._M_string_length;
    for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
      cVar1 = pcVar3[sVar7];
      if (cVar1 == '\"') {
        std::operator<<(os,'\\');
      }
      std::operator<<(os,cVar1);
    }
    std::operator<<(os,"\"");
    pbVar6 = pbStack_70;
  }
  poVar5 = std::operator<<(os,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar5 = std::operator<<(poVar5,"set_tests_properties(");
  std::__cxx11::string::string((string *)&sStack_98,(string *)&this->Test->Name);
  poVar5 = std::operator<<(poVar5,(string *)&sStack_98);
  std::operator<<(poVar5," PROPERTIES ");
  std::__cxx11::string::~string((string *)&sStack_98);
  cmPropertyMap::GetList_abi_cxx11_(&vStack_68,&this->Test->Properties);
  for (ppVar8 = vStack_68.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar8 != vStack_68.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar8 = ppVar8 + 1) {
    poVar5 = std::operator<<(os," ");
    poVar5 = std::operator<<(poVar5,(string *)ppVar8);
    poVar5 = std::operator<<(poVar5," ");
    cmOutputConverter::EscapeForCMake(&sStack_98,&ppVar8->second);
    std::operator<<(poVar5,(string *)&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_68);
  GenerateInternalProperties(this,os);
  poVar5 = std::operator<<(os,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&sStack_50);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os, Indent indent)
{
  if (this->ActionsPerConfig) {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
  } else {
    // This is an old-style test, so there is only one config.
    // assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
  }
}